

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log_Scope.h
# Opt level: O3

Log_Entry * __thiscall
Nova::Log::Log_Scope::Get_New_Scope
          (Log_Scope *this,Log_Class *instance,string *new_scope_identifier,string *new_name)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  iterator __position;
  pointer ppLVar1;
  const_iterator cVar2;
  Log_Scope *this_01;
  mapped_type *pmVar3;
  void *unaff_R13;
  pointer ppLVar4;
  Log_Entry *new_entry;
  Log_Scope *local_30;
  
  (this->super_Log_Entry).end_on_separate_line = true;
  (this->super_Log_Entry).log_file_end_on_separate_line = true;
  this_00 = &this->entries;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&this_00->_M_t,new_scope_identifier);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->entries)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (Log_Scope *)operator_new(0xc0);
    Log_Scope(this_01,&this->super_Log_Entry,(this->super_Log_Entry).depth + 1,
              (this->super_Log_Entry).timer_id,new_scope_identifier,new_name,
              (this->super_Log_Entry).verbosity_level);
    __position._M_current =
         (this->children)._data.
         super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    local_30 = this_01;
    if (__position._M_current ==
        (this->children)._data.
        super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Nova::Log::Log_Entry*,std::allocator<Nova::Log::Log_Entry*>>::
      _M_realloc_insert<Nova::Log::Log_Entry*const&>
                ((vector<Nova::Log::Log_Entry*,std::allocator<Nova::Log::Log_Entry*>> *)
                 &this->children,__position,(Log_Entry **)&local_30);
      ppLVar4 = (this->children)._data.
                super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = (Log_Entry *)this_01;
      ppLVar4 = (this->children)._data.
                super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>.
                _M_impl.super__Vector_impl_data._M_finish + 1;
      (this->children)._data.
      super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppLVar4;
    }
    ppLVar1 = (this->children)._data.
              super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](this_00,new_scope_identifier);
    *pmVar3 = (mapped_type)((ulong)((long)ppLVar4 - (long)ppLVar1) >> 3);
    return &local_30->super_Log_Entry;
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](this_00,new_scope_identifier);
  operator_delete(unaff_R13);
  _Unwind_Resume(pmVar3);
}

Assistant:

Log_Entry* Get_New_Scope(Log_Class& instance,const std::string& new_scope_identifier,const std::string& new_name)
    {
        int entry;end_on_separate_line=true;log_file_end_on_separate_line=true;
        if(entries.count(new_scope_identifier)!=0 && entries[new_scope_identifier]==entry){children(entry)->name=new_name;return children(entry);}
        Log_Entry* new_entry=new Log_Scope(this,depth+1,timer_id,new_scope_identifier,new_name,verbosity_level);
        children.Append(new_entry);
        entries[new_scope_identifier]=(int)children.size();
        return new_entry;
    }